

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

void checkValidDateTime(QDateTimeData *d,TransitionResolution resolve)

{
  QDateTimePrivate *pQVar1;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve_00;
  long in_FS_OFFSET;
  QTimeZone local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) == 0) {
    pQVar1 = (QDateTimePrivate *)
             (ulong)(pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if (((uint)((ulong)pQVar1 >> 4) & 3) - 1 < 2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      refreshSimpleDateTime(d);
      return;
    }
  }
  else {
    QDateTime::Data::timeZone((Data *)&local_20);
    resolve_00.i = 0;
    if (resolve - LegacyBehavior < 6) {
      resolve_00.i = *(Int *)(&DAT_0055d01c + (ulong)(resolve - LegacyBehavior) * 4);
    }
    refreshZonedDateTime(d,&local_20,(TransitionOptions)resolve_00.i);
    QTimeZone::~QTimeZone(&local_20);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void checkValidDateTime(QDateTimeData &d, QDateTime::TransitionResolution resolve)
{
    auto spec = extractSpec(getStatus(d));
    switch (spec) {
    case Qt::OffsetFromUTC:
    case Qt::UTC:
        // for these, a valid date and a valid time imply a valid QDateTime
        refreshSimpleDateTime(d);
        break;
    case Qt::TimeZone:
    case Qt::LocalTime:
        // For these, we need to check whether (the zone is valid and) the time
        // is valid for the zone. Expensive, but we have no other option.
        refreshZonedDateTime(d, d.timeZone(), toTransitionOptions(resolve));
        break;
    }
}